

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::AddObjectDepends
          (cmComputeTargetDepends *this,int depender_index,cmSourceFile *o,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  cmake *this_01;
  TargetType TVar2;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_d8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c8;
  undefined1 local_98 [24];
  cmGlobalGenerator *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)(local_98 + 0x10),o);
  if (local_80 == (cmGlobalGenerator *)0x0) goto LAB_003cd523;
  this_00 = (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start[depender_index];
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_98._16_8_,
             (char *)(local_98._16_8_ + (long)&local_80->_vptr_cmGlobalGenerator));
  local_d8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_d8);
  paVar1 = &local_c8.Value.field_2;
  if (local_f8 == &local_e8) {
    local_c8.Value.field_2._8_8_ = local_e8._8_8_;
    local_c8.Value._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.Value._M_dataplus._M_p = (pointer)local_f8;
  }
  local_c8.Value.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_c8.Value.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_c8.Value._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_d8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_d8.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_d8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_d8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8 = &local_e8;
  cmGeneratorTarget::ResolveLinkItem((cmLinkItem *)&local_68,this_00,&local_c8);
  if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.Value._M_dataplus._M_p,local_c8.Value.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_d8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  pVar3 = std::
          _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
          ::_M_insert_unique<cmLinkItem_const&>
                    ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                      *)emitted,(cmLinkItem *)&local_68);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 != EXECUTABLE) {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 != STATIC_LIBRARY) {
        TVar2 = cmGeneratorTarget::GetType(this_00);
        if (TVar2 != SHARED_LIBRARY) {
          TVar2 = cmGeneratorTarget::GetType(this_00);
          if (TVar2 != MODULE_LIBRARY) {
            TVar2 = cmGeneratorTarget::GetType(this_00);
            if (TVar2 != OBJECT_LIBRARY) {
              this_01 = this->GlobalGenerator->CMakeInstance;
              local_c8.Value._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,
                         "Only executables and libraries may reference target objects.","");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_98);
              cmake::IssueMessage(this_01,FATAL_ERROR,&local_c8.Value,
                                  (cmListFileBacktrace *)local_98);
              if ((cmMakefile *)local_98._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8.Value._M_dataplus._M_p != paVar1) {
                operator_delete(local_c8.Value._M_dataplus._M_p,
                                local_c8.Value.field_2._M_allocated_capacity + 1);
              }
              goto LAB_003cd4f0;
            }
          }
        }
      }
    }
    cmTarget::AddUtility(this_00->Target,(string *)(local_98 + 0x10),false,(cmMakefile *)0x0);
  }
LAB_003cd4f0:
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_allocated_capacity != local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,local_58[0]._M_allocated_capacity + 1);
  }
LAB_003cd523:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._16_8_ != &local_78) {
    operator_delete((void *)local_98._16_8_,local_78._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddObjectDepends(int depender_index,
                                              cmSourceFile const* o,
                                              std::set<cmLinkItem>& emitted)
{
  std::string const& objLib = o->GetObjectLibrary();
  if (objLib.empty()) {
    return;
  }
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmLinkItem const& objItem =
    depender->ResolveLinkItem(BT<std::string>(objLib));
  if (emitted.insert(objItem).second) {
    if (depender->GetType() != cmStateEnums::EXECUTABLE &&
        depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
        depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
        depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
        depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Only executables and libraries may reference target objects.",
        depender->GetBacktrace());
      return;
    }
    const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib,
                                                                 false);
  }
}